

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall ymfm::ym2203::generate(ym2203 *this,output_data *output,uint32_t numsamples)

{
  uint uVar1;
  code *UNRECOVERED_JUMPTABLE;
  uint32_t uVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  
  if (this->m_fm_samples_per_output == '\0') {
    if (numsamples != 0) {
      iVar4 = 0;
      iVar5 = 0;
      do {
        uVar2 = (this->m_ssg_resampler).m_sampindex;
        uVar1 = (uVar2 + iVar5) / 3;
        if (uVar2 + uVar1 * -3 == iVar4) {
          clock_fm(this);
        }
        output->data[0] = (this->m_last_fm).data[0];
        if (uVar1 * -3 + uVar2 + -1 == iVar4) {
          clock_fm(this);
          output->data[0] = ((this->m_last_fm).data[0] + output->data[0]) / 2;
        }
        iVar5 = iVar5 + 1;
        output = output + 1;
        iVar4 = iVar4 + -1;
      } while (-numsamples != iVar4);
    }
  }
  else if (numsamples != 0) {
    uVar2 = 0;
    do {
      if (((this->m_ssg_resampler).m_sampindex + uVar2) % (uint)this->m_fm_samples_per_output == 0)
      {
        clock_fm(this);
      }
      output->data[0] = (this->m_last_fm).data[0];
      uVar2 = uVar2 + 1;
      output = output + 1;
    } while (numsamples != uVar2);
  }
  UNRECOVERED_JUMPTABLE = (code *)(this->m_ssg_resampler).m_resampler;
  plVar3 = (long *)((long)(this->m_ssg_resampler).m_last.data +
                   *(long *)&(this->m_ssg_resampler).field_0x18 + -0x20);
  if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar3 + -1);
  }
  (*UNRECOVERED_JUMPTABLE)(plVar3,output + -(ulong)numsamples,numsamples);
  return;
}

Assistant:

void ym2203::generate(output_data *output, uint32_t numsamples)
{
	// FM output is just repeated the prescale number of times; note that
	// 0 is a special 1.5 case
	if (m_fm_samples_per_output != 0)
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			if ((m_ssg_resampler.sampindex() + samp) % m_fm_samples_per_output == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
		}
	}
	else
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			uint32_t step = (m_ssg_resampler.sampindex() + samp) % 3;
			if (step == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
			if (step == 1)
			{
				clock_fm();
				output->data[0] = (output->data[0] + m_last_fm.data[0]) / 2;
			}
		}
	}

	// resample the SSG as configured
	m_ssg_resampler.resample(output - numsamples, numsamples);
}